

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::initializepools(tetgenmesh *this)

{
  int iVar1;
  tetgenmesh *ptVar2;
  tetgenbehavior *ptVar3;
  bool bVar4;
  int iVar5;
  memorypool *pmVar6;
  point pdVar7;
  long lVar8;
  arraypool *paVar9;
  int iVar10;
  tetgenio *ptVar11;
  uint uVar12;
  char *this_00;
  int iVar13;
  
  this_00 = (char *)this;
  if (this->b->verbose != 0) {
    puts("  Initializing memorypools.");
    this_00 = "  tetrahedron per block: %d.\n";
    printf("  tetrahedron per block: %d.\n",(ulong)(uint)this->b->tetrahedraperblock);
  }
  inittables((tetgenmesh *)this_00);
  ptVar11 = this->in;
  ptVar2 = this->bgm;
  iVar10 = ptVar11->numberofpointattributes;
  this->numpointattrib = iVar10;
  if ((ptVar2 != (tetgenmesh *)0x0) && (iVar5 = ptVar2->in->numberofpointattributes, iVar10 < iVar5)
     ) {
    this->numpointattrib = iVar5;
  }
  if ((this->addin != (tetgenio *)0x0) &&
     (iVar10 = this->addin->numberofpointattributes, this->numpointattrib < iVar10)) {
    this->numpointattrib = iVar10;
  }
  ptVar3 = this->b;
  if (((ptVar3->weighted != 0) || (ptVar3->flipinsert != 0)) && (this->numpointattrib == 0)) {
    this->numpointattrib = 1;
  }
  if ((ptVar11->segmentconstraintlist != (double *)0x0) ||
     (ptVar11->facetconstraintlist != (double *)0x0)) {
    this->checkconstraints = 1;
  }
  iVar10 = ptVar3->plc;
  if (((iVar10 != 0) || (ptVar3->refine != 0)) &&
     ((ptVar3->nobisect == 0 || (this->checkconstraints != 0)))) {
    this->useinsertradius = 1;
  }
  iVar5 = ptVar3->psc;
  iVar1 = this->numpointattrib;
  if (iVar5 == 0) {
    this->pointmtrindex = iVar1 + 3;
  }
  else {
    this->pointmtrindex = iVar1 + 5;
    this->pointparamindex = iVar1 + 3;
  }
  iVar1 = ptVar3->metric;
  if (iVar1 == 0) {
    this->sizeoftensor = (uint)(ptVar3->quality != 0);
  }
  else {
    if ((ptVar2 != (tetgenmesh *)0x0) && (ptVar2->in != (tetgenio *)0x0)) {
      ptVar11 = ptVar2->in;
    }
    iVar13 = 1;
    if (1 < ptVar11->numberofpointmtrs) {
      iVar13 = ptVar11->numberofpointmtrs;
    }
    this->sizeoftensor = iVar13;
  }
  if (this->useinsertradius != 0) {
    this->sizeoftensor = this->sizeoftensor + 1;
  }
  iVar13 = this->sizeoftensor + this->pointmtrindex;
  this->pointinsradiusindex = this->sizeoftensor + this->pointmtrindex + -1;
  this->point2simindex = iVar13;
  if (((iVar10 == 0) && (ptVar3->refine == 0)) && (ptVar3->voroout == 0)) {
    iVar10 = iVar13 * 8 + 0x10;
  }
  else if (ptVar2 == (tetgenmesh *)0x0 || iVar1 == 0) {
    iVar10 = iVar13 * 8 + 0x18;
  }
  else {
    iVar10 = iVar13 * 8 + 0x20;
  }
  iVar10 = (int)((long)iVar10 + 3U >> 2);
  this->pointmarkindex = iVar10;
  iVar10 = ((3 - (uint)(iVar5 == 0)) + iVar10) * 8;
  pmVar6 = (memorypool *)operator_new(0x58);
  memorypool::poolinit(pmVar6,iVar10,ptVar3->vertexperblock,8,0);
  this->points = pmVar6;
  if (this->b->verbose != 0) {
    printf("  Size of a point: %d bytes.\n");
  }
  pdVar7 = (point)operator_new__((long)iVar10);
  this->dummypoint = pdVar7;
  *pdVar7 = 0.0;
  pdVar7[1] = 0.0;
  pdVar7[2] = 0.0;
  if (0 < (long)this->numpointattrib) {
    memset(pdVar7 + 3,0,(long)this->numpointattrib << 3);
  }
  if (0 < (long)this->sizeoftensor) {
    memset(pdVar7 + this->pointmtrindex,0,(long)this->sizeoftensor << 3);
  }
  lVar8 = (long)this->point2simindex;
  pdVar7[lVar8] = 0.0;
  (pdVar7 + lVar8)[1] = 0.0;
  ptVar3 = this->b;
  if (((ptVar3->plc != 0) || (ptVar3->psc != 0)) || (ptVar3->refine != 0)) {
    pdVar7[lVar8 + 2] = 0.0;
    if ((ptVar3->metric != 0) && (this->bgm != (tetgenmesh *)0x0)) {
      pdVar7[lVar8 + 3] = 0.0;
    }
  }
  pdVar7 = this->dummypoint;
  *(undefined4 *)((long)pdVar7 + (long)this->pointmarkindex * 4) = 0xffffffff;
  *(undefined4 *)((long)pdVar7 + (long)this->pointmarkindex * 4 + 4) = 0;
  *(uint *)((long)pdVar7 + (long)this->pointmarkindex * 4 + 4) =
       (uint)*(byte *)((long)pdVar7 + (long)this->pointmarkindex * 4 + 4);
  this->elemmarkerindex = 0x16;
  ptVar3 = this->b;
  iVar10 = this->in->numberoftetrahedronattributes;
  bVar4 = 0 < ptVar3->regionattrib;
  iVar5 = iVar10 + (uint)bVar4;
  this->numelemattrib = iVar5;
  this->elemattribindex = 0xc;
  iVar10 = iVar10 + (uint)bVar4 + 0xc;
  this->volumeboundindex = iVar10;
  if (ptVar3->varvolume == 0) {
    uVar12 = 0x60;
    if (0 < iVar5) {
      uVar12 = iVar10 * 8;
    }
  }
  else {
    uVar12 = iVar5 * 8 + 0x68;
  }
  pmVar6 = (memorypool *)operator_new(0x58);
  memorypool::poolinit(pmVar6,uVar12,ptVar3->tetrahedraperblock,8,0x10);
  this->tetrahedrons = pmVar6;
  if (this->b->verbose != 0) {
    printf("  Size of a tetrahedron: %d (%d) bytes.\n",(ulong)uVar12,(ulong)(uint)pmVar6->itembytes)
    ;
  }
  ptVar3 = this->b;
  if ((ptVar3->plc != 0) || (ptVar3->refine != 0)) {
    this->areaboundindex = 0xb;
    iVar10 = (uint)(this->checkconstraints != 0) * 2 + 0x16;
    this->shmarkindex = iVar10;
    uVar12 = (iVar10 + this->useinsertradius) * 8 + 0x10;
    pmVar6 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar6,uVar12,ptVar3->shellfaceperblock,8,8);
    this->subfaces = pmVar6;
    if (this->b->verbose != 0) {
      printf("  Size of a shellface: %d (%d) bytes.\n",(ulong)uVar12,(ulong)(uint)pmVar6->itembytes)
      ;
    }
    pmVar6 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar6,uVar12,this->b->shellfaceperblock,8,8);
    this->subsegs = pmVar6;
    pmVar6 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar6,0x30,this->b->shellfaceperblock,8,0);
    this->tet2segpool = pmVar6;
    pmVar6 = (memorypool *)operator_new(0x58);
    memorypool::poolinit(pmVar6,0x20,this->b->shellfaceperblock,8,0);
    this->tet2subpool = pmVar6;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x400;
    paVar9->log2objectsperblock = 10;
    paVar9->objectsperblockmark = 0x3ff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->subsegstack = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x400;
    paVar9->log2objectsperblock = 10;
    paVar9->objectsperblockmark = 0x3ff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->subfacstack = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 8;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->subvertstack = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->caveshlist = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->caveshbdlist = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x10;
    paVar9->log2objectsperblock = 4;
    paVar9->objectsperblockmark = 0xf;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->cavesegshlist = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->cavetetshlist = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->cavetetseglist = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->caveencshlist = paVar9;
    paVar9 = (arraypool *)operator_new(0x30);
    paVar9->objectbytes = 0x10;
    paVar9->objectsperblock = 0x100;
    paVar9->log2objectsperblock = 8;
    paVar9->objectsperblockmark = 0xff;
    paVar9->toparraylen = 0;
    paVar9->toparray = (char **)0x0;
    paVar9->objects = 0;
    paVar9->totalmemory = 0;
    this->caveencseglist = paVar9;
  }
  pmVar6 = (memorypool *)operator_new(0x58);
  memorypool::poolinit(pmVar6,0x88,0x400,8,0);
  this->flippool = pmVar6;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x88;
  paVar9->objectsperblock = 0x400;
  paVar9->log2objectsperblock = 10;
  paVar9->objectsperblockmark = 0x3ff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->unflipqueue = paVar9;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x10;
  paVar9->objectsperblock = 0x400;
  paVar9->log2objectsperblock = 10;
  paVar9->objectsperblockmark = 0x3ff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->cavetetlist = paVar9;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x10;
  paVar9->objectsperblock = 0x400;
  paVar9->log2objectsperblock = 10;
  paVar9->objectsperblockmark = 0x3ff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->cavebdrylist = paVar9;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 0x10;
  paVar9->objectsperblock = 0x400;
  paVar9->log2objectsperblock = 10;
  paVar9->objectsperblockmark = 0x3ff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->caveoldtetlist = paVar9;
  paVar9 = (arraypool *)operator_new(0x30);
  paVar9->objectbytes = 8;
  paVar9->objectsperblock = 0x400;
  paVar9->log2objectsperblock = 10;
  paVar9->objectsperblockmark = 0x3ff;
  paVar9->toparraylen = 0;
  paVar9->toparray = (char **)0x0;
  paVar9->objects = 0;
  paVar9->totalmemory = 0;
  this->cavetetvertlist = paVar9;
  return;
}

Assistant:

void tetgenmesh::initializepools()
{
  int pointsize = 0, elesize = 0, shsize = 0;
  int i;

  if (b->verbose) {
    printf("  Initializing memorypools.\n");
    printf("  tetrahedron per block: %d.\n", b->tetrahedraperblock);
  }

  inittables();

  // There are three input point lists available, which are in, addin,
  //   and bgm->in. These point lists may have different number of 
  //   attributes. Decide the maximum number.
  numpointattrib = in->numberofpointattributes;
  if (bgm != NULL) {
    if (bgm->in->numberofpointattributes > numpointattrib) {
      numpointattrib = bgm->in->numberofpointattributes;
    }
  }
  if (addin != NULL) {
    if (addin->numberofpointattributes > numpointattrib) {
      numpointattrib = addin->numberofpointattributes;
    }
  }
  if (b->weighted || b->flipinsert) { // -w or -L.
    // The internal number of point attribute needs to be at least 1
    //   (for storing point weights).
    if (numpointattrib == 0) {    
      numpointattrib = 1;
    }
  }

  // Default varconstraint = 0;
  if (in->segmentconstraintlist || in->facetconstraintlist) {
    checkconstraints = 1;
  }
  if (b->plc || b->refine) {
    // Save the insertion radius for Steiner points if boundaries
    //   are allowed be split.
    if (!b->nobisect || checkconstraints) {
      useinsertradius = 1;
    }
  }

  // The index within each point at which its metric tensor is found. 
  // Each vertex has three coordinates.
  if (b->psc) {
    // '-s' option (PSC), the u,v coordinates are provided.
    pointmtrindex = 5 + numpointattrib;
    // The index within each point at which its u, v coordinates are found.
    // Comment: They are saved after the list of point attributes.
    pointparamindex = pointmtrindex - 2;
  } else {
    pointmtrindex = 3 + numpointattrib;
  }
  // For '-m' option. A tensor field is provided (*.mtr or *.b.mtr file).
  if (b->metric) {
    // Decide the size (1, 3, or 6) of the metric tensor.
    if (bgm != (tetgenmesh *) NULL) {
      // A background mesh is allocated. It may not exist though.
      sizeoftensor = (bgm->in != (tetgenio *) NULL) ? 
        bgm->in->numberofpointmtrs : in->numberofpointmtrs;
    } else {
      // No given background mesh - Itself is a background mesh.
      sizeoftensor = in->numberofpointmtrs;
    }
    // Make sure sizeoftensor is at least 1.
    sizeoftensor = (sizeoftensor > 0) ? sizeoftensor : 1;
  } else {
    // For '-q' option. Make sure to have space for saving a scalar value.
    sizeoftensor = b->quality ? 1 : 0;
  }
  if (useinsertradius) {
    // Increase a space (REAL) for saving point insertion radius, it is
    //   saved directly after the metric. 
    sizeoftensor++;
  }
  pointinsradiusindex = pointmtrindex + sizeoftensor - 1;
  // The index within each point at which an element pointer is found, where
  //   the index is measured in pointers. Ensure the index is aligned to a
  //   sizeof(tetrahedron)-byte address.
  point2simindex = ((pointmtrindex + sizeoftensor) * sizeof(REAL)
                 + sizeof(tetrahedron) - 1) / sizeof(tetrahedron);
  if (b->plc || b->refine || b->voroout) {
    // Increase the point size by three pointers, which are:
    //   - a pointer to a tet, read by point2tet();
    //   - a pointer to a parent point, read by point2ppt()).
    //   - a pointer to a subface or segment, read by point2sh();
    if (b->metric && (bgm != (tetgenmesh *) NULL)) {
      // Increase one pointer into the background mesh, point2bgmtet().
      pointsize = (point2simindex + 4) * sizeof(tetrahedron);
    } else {
      pointsize = (point2simindex + 3) * sizeof(tetrahedron);
    }
  } else {
    // Increase the point size by two pointer, which are:
    //   - a pointer to a tet, read by point2tet();
    //   - a pointer to a parent point, read by point2ppt()). -- Used by btree.
    pointsize = (point2simindex + 2) * sizeof(tetrahedron);
  }
  // The index within each point at which the boundary marker is found,
  //   Ensure the point marker is aligned to a sizeof(int)-byte address.
  pointmarkindex = (pointsize + sizeof(int) - 1) / sizeof(int);
  // Now point size is the ints (indicated by pointmarkindex) plus:
  //   - an integer for boundary marker;
  //   - an integer for vertex type;
  //   - an integer for geometry tag (optional, -s option).
  pointsize = (pointmarkindex + 2 + (b->psc ? 1 : 0)) * sizeof(tetrahedron);

  // Initialize the pool of vertices.
  points = new memorypool(pointsize, b->vertexperblock, sizeof(REAL), 0);

  if (b->verbose) {
    printf("  Size of a point: %d bytes.\n", points->itembytes);
  }

  // Initialize the infinite vertex.
  dummypoint = (point) new char[pointsize];
  // Initialize all fields of this point.
  dummypoint[0] = 0.0;
  dummypoint[1] = 0.0;
  dummypoint[2] = 0.0;
  for (i = 0; i < numpointattrib; i++) {
    dummypoint[3 + i] = 0.0;
  }
  // Initialize the metric tensor.
  for (i = 0; i < sizeoftensor; i++) {
    dummypoint[pointmtrindex + i] = 0.0;
  }
  setpoint2tet(dummypoint, NULL);
  setpoint2ppt(dummypoint, NULL);
  if (b->plc || b->psc || b->refine) {
    // Initialize the point-to-simplex field.
    setpoint2sh(dummypoint, NULL);
    if (b->metric && (bgm != NULL)) {
      setpoint2bgmtet(dummypoint, NULL);
    }
  }
  // Initialize the point marker (starting from in->firstnumber).
  setpointmark(dummypoint, -1); // The unique marker for dummypoint.
  // Clear all flags.
  ((int *) (dummypoint))[pointmarkindex + 1] = 0;
  // Initialize (set) the point type. 
  setpointtype(dummypoint, UNUSEDVERTEX); // Does not matter.

  // The number of bytes occupied by a tetrahedron is varying by the user-
  //   specified options. The contents of the first 12 pointers are listed
  //   in the following table:
  //     [0]  |__ neighbor at f0 __|
  //     [1]  |__ neighbor at f1 __|
  //     [2]  |__ neighbor at f2 __|
  //     [3]  |__ neighbor at f3 __|
  //     [4]  |_____ vertex p0 ____|
  //     [5]  |_____ vertex p1 ____|
  //     [6]  |_____ vertex p2 ____|
  //     [7]  |_____ vertex p3 ____|
  //     [8]  |__ segments array __| (used by -p)
  //     [9]  |__ subfaces array __| (used by -p)
  //    [10]  |_____ reserved _____|
  //    [11]  |___ elem marker ____| (used as an integer)

  elesize = 12 * sizeof(tetrahedron); 

  // The index to find the element markers. An integer containing varies
  //   flags and element counter. 
  if (!(sizeof(int) <= sizeof(tetrahedron)) ||
      ((sizeof(tetrahedron) % sizeof(int)))) {
    terminatetetgen(this, 2);
  }
  elemmarkerindex = (elesize - sizeof(tetrahedron)) / sizeof(int);

  // The actual number of element attributes. Note that if the
  //   `b->regionattrib' flag is set, an additional attribute will be added.
  numelemattrib = in->numberoftetrahedronattributes + (b->regionattrib > 0);

  // The index within each element at which its attributes are found, where
  //   the index is measured in REALs. 
  elemattribindex = (elesize + sizeof(REAL) - 1) / sizeof(REAL);
  // The index within each element at which the maximum volume bound is
  //   found, where the index is measured in REALs.
  volumeboundindex = elemattribindex + numelemattrib;
  // If element attributes or an constraint are needed, increase the number
  //   of bytes occupied by an element.
  if (b->varvolume) {
    elesize = (volumeboundindex + 1) * sizeof(REAL);
  } else if (numelemattrib > 0) {
    elesize = volumeboundindex * sizeof(REAL);
  }


  // Having determined the memory size of an element, initialize the pool.
  tetrahedrons = new memorypool(elesize, b->tetrahedraperblock, sizeof(void *),
                                16);

  if (b->verbose) {
    printf("  Size of a tetrahedron: %d (%d) bytes.\n", elesize,
           tetrahedrons->itembytes);
  }

  if (b->plc || b->refine) { // if (b->useshelles) {
    // The number of bytes occupied by a subface.  The list of pointers
    //   stored in a subface are: three to other subfaces, three to corners,
    //   three to subsegments, two to tetrahedra.
    shsize = 11 * sizeof(shellface);
    // The index within each subface at which the maximum area bound is
    //   found, where the index is measured in REALs.
    areaboundindex = (shsize + sizeof(REAL) - 1) / sizeof(REAL);
    // If -q switch is in use, increase the number of bytes occupied by
    //   a subface for saving maximum area bound.
    if (checkconstraints) { 
      shsize = (areaboundindex + 1) * sizeof(REAL);
    } else {
      shsize = areaboundindex * sizeof(REAL);
    }
    // The index within subface at which the facet marker is found. Ensure
    //   the marker is aligned to a sizeof(int)-byte address.
    shmarkindex = (shsize + sizeof(int) - 1) / sizeof(int);
    // Increase the number of bytes by two or three integers, one for facet
    //   marker, one for shellface type and flags, and optionally one
	//   for storing facet index (for mesh refinement).
    shsize = (shmarkindex + 2 + useinsertradius) * sizeof(shellface);

    // Initialize the pool of subfaces. Each subface record is eight-byte
    //   aligned so it has room to store an edge version (from 0 to 5) in
    //   the least three bits.
    subfaces = new memorypool(shsize, b->shellfaceperblock, sizeof(void *), 8);

    if (b->verbose) {
      printf("  Size of a shellface: %d (%d) bytes.\n", shsize,
             subfaces->itembytes);
    }

    // Initialize the pool of subsegments. The subsegment's record is same
    //   with subface.
    subsegs = new memorypool(shsize, b->shellfaceperblock, sizeof(void *), 8);

    // Initialize the pool for tet-subseg connections.
    tet2segpool = new memorypool(6 * sizeof(shellface), b->shellfaceperblock, 
                                 sizeof(void *), 0);
    // Initialize the pool for tet-subface connections.
    tet2subpool = new memorypool(4 * sizeof(shellface), b->shellfaceperblock, 
                                 sizeof(void *), 0);

    // Initialize arraypools for segment & facet recovery.
    subsegstack = new arraypool(sizeof(face), 10);
    subfacstack = new arraypool(sizeof(face), 10);
    subvertstack = new arraypool(sizeof(point), 8);

    // Initialize arraypools for surface point insertion/deletion.
    caveshlist = new arraypool(sizeof(face), 8);
    caveshbdlist = new arraypool(sizeof(face), 8);
    cavesegshlist = new arraypool(sizeof(face), 4);

    cavetetshlist = new arraypool(sizeof(face), 8);
    cavetetseglist = new arraypool(sizeof(face), 8);
    caveencshlist = new arraypool(sizeof(face), 8);
    caveencseglist = new arraypool(sizeof(face), 8);
  }

  // Initialize the pools for flips.
  flippool = new memorypool(sizeof(badface), 1024, sizeof(void *), 0);
  unflipqueue = new arraypool(sizeof(badface), 10);

  // Initialize the arraypools for point insertion.
  cavetetlist = new arraypool(sizeof(triface), 10);
  cavebdrylist = new arraypool(sizeof(triface), 10);
  caveoldtetlist = new arraypool(sizeof(triface), 10);
  cavetetvertlist = new arraypool(sizeof(point), 10);
}